

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_rectangle_rounded(rf_rec rec,float roundness,int segments,rf_color color)

{
  float x;
  float y;
  rf_render_batch *prVar1;
  rf_vertex_buffer *prVar2;
  uchar y_00;
  uchar z;
  uchar x_00;
  int iVar3;
  ulong uVar4;
  long lVar5;
  rf_int k;
  long lVar6;
  uchar w;
  float x_01;
  float fVar7;
  float fVar8;
  float fVar9;
  float y_01;
  float fVar10;
  float fVar11;
  float y_02;
  float fVar12;
  float x_02;
  float y_03;
  float local_100;
  undefined8 local_68;
  float local_60;
  float local_5c;
  undefined8 local_58;
  float local_50;
  float local_4c;
  long local_40;
  ulong local_38;
  
  fVar10 = rec.width;
  fVar11 = rec.height;
  x_01 = rec.x;
  y_01 = rec.y;
  if (((0.0 < roundness) && (1.0 <= fVar10)) && (1.0 <= fVar11)) {
    fVar12 = 1.0;
    if (roundness <= 1.0) {
      fVar12 = roundness;
    }
    fVar7 = fVar11;
    if (fVar10 <= fVar11) {
      fVar7 = fVar10;
    }
    fVar12 = fVar7 * fVar12 * 0.5;
    if (0.0 < fVar12) {
      uVar4 = (ulong)(uint)segments;
      y_00 = color.g;
      z = color.b;
      if (segments < 4) {
        fVar7 = -0.5 / fVar12 + 1.0;
        fVar7 = fVar7 * fVar7;
        fVar7 = acosf(fVar7 + fVar7 + -1.0);
        fVar7 = ceilf(6.2831855 / fVar7);
        uVar4 = 4;
        if (0 < (int)(fVar7 * 0.25)) {
          uVar4 = (ulong)(uint)(int)(fVar7 * 0.25);
        }
      }
      iVar3 = (int)uVar4;
      fVar10 = fVar10 + x_01;
      fVar11 = fVar11 + y_01;
      x_02 = x_01 + fVar12;
      y_03 = y_01 + fVar12;
      local_68 = CONCAT44(y_03,x_02);
      fVar7 = fVar10 - fVar12;
      y_02 = fVar11 - fVar12;
      local_58 = CONCAT44(y_02,fVar7);
      prVar1 = (rf__ctx->field_0).current_batch;
      lVar6 = prVar1->current_buffer;
      prVar2 = prVar1->vertex_buffers;
      local_60 = fVar7;
      local_5c = y_03;
      local_50 = x_02;
      local_4c = y_02;
      if (prVar2[lVar6].elements_count * 4 <= prVar2[lVar6].v_counter + iVar3 * 0xc + 0x1e) {
        rf_gfx_draw();
      }
      rf_gfx_begin(RF_TRIANGLES);
      local_40 = (long)iVar3;
      lVar6 = 0;
      x_00 = color.r;
      w = color.a;
      local_38 = uVar4;
      do {
        if (0 < (int)local_38) {
          x = *(float *)(&local_68 + lVar6);
          y = *(float *)((long)&local_68 + lVar6 * 8 + 4);
          local_100 = (float)(&DAT_001781b0)[lVar6];
          lVar5 = local_40;
          do {
            rf_gfx_color4ub(x_00,y_00,z,w);
            rf_gfx_vertex3f(x,y,((rf__ctx->field_0).current_batch)->current_depth);
            fVar8 = sinf(local_100 * 0.017453292);
            fVar9 = cosf(local_100 * 0.017453292);
            rf_gfx_vertex3f(fVar8 * fVar12 + x,fVar9 * fVar12 + y,
                            ((rf__ctx->field_0).current_batch)->current_depth);
            local_100 = local_100 + 90.0 / (float)iVar3;
            fVar8 = sinf(local_100 * 0.017453292);
            fVar9 = cosf(local_100 * 0.017453292);
            rf_gfx_vertex3f(fVar8 * fVar12 + x,fVar9 * fVar12 + y,
                            ((rf__ctx->field_0).current_batch)->current_depth);
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      rf_gfx_color4ub(x_00,y_00,z,w);
      rf_gfx_vertex3f(x_02,y_01,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_02,y_03,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,y_03,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,y_01,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_02,y_01,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,y_03,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_color4ub(x_00,y_00,z,w);
      rf_gfx_vertex3f(fVar7,y_03,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,y_02,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar10,y_02,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar10,y_03,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,y_03,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar10,y_02,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_color4ub(x_00,y_00,z,w);
      rf_gfx_vertex3f(x_02,y_02,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_02,fVar11,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,fVar11,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,y_02,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_02,y_02,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,fVar11,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_color4ub(x_00,y_00,z,w);
      rf_gfx_vertex3f(x_01,y_03,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_01,y_02,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_02,y_02,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_02,y_03,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_01,y_03,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_02,y_02,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_color4ub(x_00,y_00,z,w);
      rf_gfx_vertex3f(x_02,y_03,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_02,y_02,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,y_02,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,y_03,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_02,y_03,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,y_02,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_end();
    }
    return;
  }
  rf_draw_rectangle_pro(rec,(rf_vec2)0x0,0.0,color);
  return;
}

Assistant:

RF_API void rf_draw_rectangle_rounded(rf_rec rec, float roundness, int segments, rf_color color)
{
    // Not a rounded rectangle
    if ((roundness <= 0.0f) || (rec.width < 1) || (rec.height < 1 ))
    {
        rf_draw_rectangle_pro(rec, (rf_vec2){0.0f, 0.0f}, 0.0f, color);
        return;
    }

    if (roundness >= 1.0f) roundness = 1.0f;

    // Calculate corner radius
    float radius = (rec.width > rec.height)? (rec.height*roundness)/2 : (rec.width*roundness)/2;
    if (radius <= 0.0f) return;

    // Calculate number of segments to use for the corners
    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088

        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = ceilf(2 * RF_PI / th) / 4;
        if (segments <= 0) segments = 4;
    }

    float step_length = 90.0f/(float)segments;

    /*  Quick sketch to make sense of all of this (there are 9 parts to draw, also mark the 12 points we'll use below)
     *  Not my best attempt at ASCII art, just preted it's rounded rectangle :)
     *     P0                    P1
     *       ____________________
     *     /|                    |\
     *    /1|          2         |3\
     *P7 /__|____________________|__\ P2
     *  /   |                    |  _\ P2
     *  |   |P8                P9|   |
     *  | 8 |          9         | 4 |
     *  | __|____________________|__ |
     *P6 \  |P11              P10|  / P3
     *    \7|          6         |5/
     *     \|____________________|/
     *     P5                    P4
     */

    const rf_vec2 point[12] = { // coordinates of the 12 points that define the rounded rect (the idea here is to make things easier)
            {(float)rec.x + radius, rec.y}, {(float)(rec.x + rec.width) - radius, rec.y}, { rec.x + rec.width, (float)rec.y + radius }, // PO, P1, P2
            {rec.x + rec.width, (float)(rec.y + rec.height) - radius}, {(float)(rec.x + rec.width) - radius, rec.y + rec.height}, // P3, P4
            {(float)rec.x + radius, rec.y + rec.height}, { rec.x, (float)(rec.y + rec.height) - radius}, {rec.x, (float)rec.y + radius}, // P5, P6, P7
            {(float)rec.x + radius, (float)rec.y + radius}, {(float)(rec.x + rec.width) - radius, (float)rec.y + radius}, // P8, P9
            {(float)(rec.x + rec.width) - radius, (float)(rec.y + rec.height) - radius}, {(float)rec.x + radius, (float)(rec.y + rec.height) - radius} // P10, P11
    };

    const rf_vec2 centers[4] = {point[8], point[9], point[10], point[11] };
    const float angles[4] = { 180.0f, 90.0f, 0.0f, 270.0f };
    if (rf_gfx_check_buffer_limit(12*segments + 5*6)) rf_gfx_draw(); // 4 corners with 3 vertices per segment + 5 rectangles with 6 vertices each

    rf_gfx_begin(RF_TRIANGLES);
    // Draw all of the 4 corners: [1] Upper Left Corner, [3] Upper Right Corner, [5] Lower Right Corner, [7] Lower Left Corner
    for (rf_int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
    {
        float angle = angles[k];
        const rf_vec2 center = centers[k];
        for (rf_int i = 0; i < segments; i++)
        {
            rf_gfx_color4ub(color.r, color.g, color.b, color.a);
            rf_gfx_vertex2f(center.x, center.y);
            rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*radius, center.y + cosf(RF_DEG2RAD*angle)*radius);
            rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*radius);
            angle += step_length;
        }
    }

    // [2] Upper rf_rec
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(point[0].x, point[0].y);
    rf_gfx_vertex2f(point[8].x, point[8].y);
    rf_gfx_vertex2f(point[9].x, point[9].y);
    rf_gfx_vertex2f(point[1].x, point[1].y);
    rf_gfx_vertex2f(point[0].x, point[0].y);
    rf_gfx_vertex2f(point[9].x, point[9].y);

    // [4] Right rf_rec
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(point[9].x, point[9].y);
    rf_gfx_vertex2f(point[10].x, point[10].y);
    rf_gfx_vertex2f(point[3].x, point[3].y);
    rf_gfx_vertex2f(point[2].x, point[2].y);
    rf_gfx_vertex2f(point[9].x, point[9].y);
    rf_gfx_vertex2f(point[3].x, point[3].y);

    // [6] Bottom rf_rec
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(point[11].x, point[11].y);
    rf_gfx_vertex2f(point[5].x, point[5].y);
    rf_gfx_vertex2f(point[4].x, point[4].y);
    rf_gfx_vertex2f(point[10].x, point[10].y);
    rf_gfx_vertex2f(point[11].x, point[11].y);
    rf_gfx_vertex2f(point[4].x, point[4].y);

    // [8] Left rf_rec
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(point[7].x, point[7].y);
    rf_gfx_vertex2f(point[6].x, point[6].y);
    rf_gfx_vertex2f(point[11].x, point[11].y);
    rf_gfx_vertex2f(point[8].x, point[8].y);
    rf_gfx_vertex2f(point[7].x, point[7].y);
    rf_gfx_vertex2f(point[11].x, point[11].y);

    // [9] Middle rf_rec
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(point[8].x, point[8].y);
    rf_gfx_vertex2f(point[11].x, point[11].y);
    rf_gfx_vertex2f(point[10].x, point[10].y);
    rf_gfx_vertex2f(point[9].x, point[9].y);
    rf_gfx_vertex2f(point[8].x, point[8].y);
    rf_gfx_vertex2f(point[10].x, point[10].y);
    rf_gfx_end();

}